

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O1

statement_base * __thiscall
cs::method_foreach_do::translate
          (method_foreach_do *this,context_t *context,
          deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
          *raw)

{
  ulong uVar1;
  value_type ptVar2;
  token_base *ptVar3;
  element_type *peVar4;
  _func_int **pp_Var5;
  element_type *peVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var7;
  _Elt_pointer pdVar8;
  int iVar9;
  const_reference pptVar10;
  token_base **pptVar11;
  statement_foreach *this_00;
  undefined4 extraout_var;
  _Map_pointer ppdVar12;
  undefined4 extraout_var_00;
  _Elt_pointer pptVar13;
  internal_error *this_01;
  compile_error *this_02;
  long lVar14;
  ulong uVar15;
  context_t *context_00;
  size_t size;
  long lVar16;
  _Self __tmp;
  deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> body;
  allocator_type local_191;
  tree_type<cs::token_base_*> local_190;
  context_t local_188;
  _Deque_iterator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_const_std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_&,_const_std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_*>
  local_178;
  string local_158;
  undefined1 local_138 [16];
  tree_node local_128;
  _Elt_pointer local_108;
  _Elt_pointer ppsStack_100;
  _Elt_pointer local_f8;
  _Map_pointer pppsStack_f0;
  deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
  local_e8;
  _Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> local_98;
  _Deque_iterator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_const_std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_&,_const_std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_*>
  local_48;
  
  pptVar10 = std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::at
                       ((raw->
                        super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
                        )._M_impl.super__Deque_impl_data._M_start._M_cur,1);
  ptVar2 = *pptVar10;
  local_138._0_8_ = ptVar2[1]._vptr_token_base;
  pptVar11 = tree_type<cs::token_base_*>::iterator::data((iterator *)local_138);
  if (*pptVar11 == (token_base *)0x0) {
    this_01 = (internal_error *)__cxa_allocate_exception(0x28);
    local_138._0_8_ = &local_128;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_138,"Null pointer accessed.","")
    ;
    internal_error::internal_error(this_01,(string *)local_138);
    __cxa_throw(this_01,&internal_error::typeinfo,internal_error::~internal_error);
  }
  local_138._0_8_ = ptVar2[1]._vptr_token_base;
  pptVar11 = tree_type<cs::token_base_*>::iterator::data((iterator *)local_138);
  iVar9 = (*(*pptVar11)->_vptr_token_base[2])();
  if (iVar9 == 4) {
    local_138._0_8_ = ptVar2[1]._vptr_token_base;
    pptVar11 = tree_type<cs::token_base_*>::iterator::data((iterator *)local_138);
    ptVar3 = *pptVar11;
    local_f8 = (_Elt_pointer)0x0;
    pppsStack_f0 = (_Map_pointer)0x0;
    local_108 = (_Elt_pointer)0x0;
    ppsStack_100 = (_Elt_pointer)0x0;
    local_128.right = (tree_node *)0x0;
    local_128.data = (token_base *)0x0;
    local_128.root = (tree_node *)0x0;
    local_128.left = (tree_node *)0x0;
    local_138._0_8_ = (tree_node *)0x0;
    local_138._8_8_ = 0;
    std::_Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::_M_initialize_map
              ((_Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)local_138
               ,0);
    peVar4 = (((context->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
             compiler).super___shared_ptr<cs::compiler_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_178._M_cur =
         (raw->
         super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
         )._M_impl.super__Deque_impl_data._M_start._M_cur;
    local_178._M_first =
         (raw->
         super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
         )._M_impl.super__Deque_impl_data._M_start._M_first;
    local_178._M_last =
         (raw->
         super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
         )._M_impl.super__Deque_impl_data._M_start._M_last;
    local_178._M_node =
         (raw->
         super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
         )._M_impl.super__Deque_impl_data._M_start._M_node;
    lVar16 = (long)local_178._M_cur - (long)local_178._M_first;
    lVar14 = lVar16 >> 4;
    uVar1 = lVar14 * -0x3333333333333333 + 1;
    if (uVar1 < 6) {
      local_178._M_cur = local_178._M_cur + 1;
    }
    else {
      if (lVar16 < -0x4f) {
        uVar15 = ~((lVar14 * 0x3333333333333333 - 2U) / 6);
      }
      else {
        uVar15 = uVar1 / 6;
      }
      local_178._M_node = local_178._M_node + uVar15;
      local_178._M_first = *local_178._M_node;
      local_178._M_last = local_178._M_first + 6;
      local_178._M_cur = local_178._M_first + uVar15 * -6 + uVar1;
    }
    local_48._M_cur =
         (raw->
         super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
         )._M_impl.super__Deque_impl_data._M_finish._M_cur;
    local_48._M_first =
         (raw->
         super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
         )._M_impl.super__Deque_impl_data._M_finish._M_first;
    local_48._M_last =
         (raw->
         super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
         )._M_impl.super__Deque_impl_data._M_finish._M_last;
    local_48._M_node =
         (raw->
         super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
         )._M_impl.super__Deque_impl_data._M_finish._M_node;
    std::
    deque<std::deque<cs::token_base*,std::allocator<cs::token_base*>>,std::allocator<std::deque<cs::token_base*,std::allocator<cs::token_base*>>>>
    ::
    deque<std::_Deque_iterator<std::deque<cs::token_base*,std::allocator<cs::token_base*>>,std::deque<cs::token_base*,std::allocator<cs::token_base*>>const&,std::deque<cs::token_base*,std::allocator<cs::token_base*>>const*>,void>
              ((deque<std::deque<cs::token_base*,std::allocator<cs::token_base*>>,std::allocator<std::deque<cs::token_base*,std::allocator<cs::token_base*>>>>
                *)&local_e8,&local_178,&local_48,&local_191);
    context_00 = &peVar4->context;
    translator_type::translate
              (&peVar4->translator,context_00,&local_e8,
               (deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)local_138,false
              );
    std::
    deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
    ::~deque(&local_e8);
    this_00 = (statement_foreach *)
              statement_base::operator_new((statement_base *)0x98,(size_t)context_00);
    pp_Var5 = ptVar3[3]._vptr_token_base;
    local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_158,pp_Var5,ptVar3[3].line_num + (long)pp_Var5);
    pptVar10 = std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::at
                         ((raw->
                          super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
                          )._M_impl.super__Deque_impl_data._M_start._M_cur,3);
    size = 0;
    iVar9 = tree_type<cs::token_base_*>::copy
                      ((EVP_PKEY_CTX *)(*pptVar10)[1]._vptr_token_base,(EVP_PKEY_CTX *)0x0);
    local_190.mRoot = (tree_node *)CONCAT44(extraout_var,iVar9);
    ppdVar12 = (_Map_pointer)statement_base::operator_new((statement_base *)0x28,size);
    pptVar10 = std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::at
                         ((raw->
                          super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
                          )._M_impl.super__Deque_impl_data._M_start._M_cur,5);
    iVar9 = tree_type<cs::token_base_*>::copy
                      ((EVP_PKEY_CTX *)(*pptVar10)[1]._vptr_token_base,(EVP_PKEY_CTX *)0x0);
    peVar6 = (context->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    p_Var7 = (context->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)._M_refcount
             ._M_pi;
    if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
      }
    }
    pdVar8 = (raw->
             super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
             )._M_impl.super__Deque_impl_data._M_start._M_cur;
    pptVar13 = (pdVar8->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
               _M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (pptVar13 ==
        (pdVar8->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>)._M_impl.
        super__Deque_impl_data._M_finish._M_first) {
      pptVar13 = (pdVar8->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
                 _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    ptVar3 = pptVar13[-1];
    *ppdVar12 = (deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)
                &PTR__statement_base_0025e3f0;
    ppdVar12[1] = (deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)peVar6;
    ppdVar12[2] = (deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)p_Var7;
    ppdVar12[3] = (deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)ptVar3->line_num;
    *ppdVar12 = (deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)
                &PTR__statement_expression_0025ef88;
    ppdVar12[4] = (deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)
                  CONCAT44(extraout_var_00,iVar9);
    local_98._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
    local_98._M_impl.super__Deque_impl_data._M_map_size = 0;
    local_98._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
    local_98._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
    local_98._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
    local_98._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
    local_98._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
    local_98._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
    local_98._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
    local_98._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
    local_e8.
    super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
    ._M_impl.super__Deque_impl_data._M_map = ppdVar12;
    std::deque<cs::statement_base*,std::allocator<cs::statement_base*>>::
    _M_range_initialize<cs::statement_base*const*>
              ((deque<cs::statement_base*,std::allocator<cs::statement_base*>> *)&local_98,&local_e8
              );
    local_188.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (context->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    local_188.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (context->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
         _M_pi;
    if (local_188.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_188.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (local_188.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_refcount
             ._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_188.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (local_188.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_refcount
             ._M_pi)->_M_use_count + 1;
      }
    }
    pdVar8 = (raw->
             super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
             )._M_impl.super__Deque_impl_data._M_start._M_cur;
    pptVar13 = (pdVar8->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
               _M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (pptVar13 ==
        (pdVar8->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>)._M_impl.
        super__Deque_impl_data._M_finish._M_first) {
      pptVar13 = (pdVar8->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
                 _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    statement_foreach::statement_foreach
              (this_00,&local_158,&local_190,
               (deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)&local_98,
               &local_188,pptVar13[-1]);
    if (local_188.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_188.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    std::_Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::~_Deque_base
              (&local_98);
    tree_type<cs::token_base_*>::destroy((tree_node *)0x0);
    tree_type<cs::token_base_*>::destroy(local_190.mRoot);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158._M_dataplus._M_p != &local_158.field_2) {
      operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
    }
    std::_Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::~_Deque_base
              ((_Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)local_138
              );
    return &this_00->super_statement_base;
  }
  this_02 = (compile_error *)__cxa_allocate_exception(0x28);
  local_138._0_8_ = &local_128;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_138,"Wrong grammar in foreach statement, expect <id>","");
  compile_error::compile_error(this_02,(string *)local_138);
  __cxa_throw(this_02,&compile_error::typeinfo,compile_error::~compile_error);
}

Assistant:

statement_base *
	method_foreach_do::translate(const context_t &context, const std::deque<std::deque<token_base *>> &raw)
	{
		tree_type<token_base *> &t = static_cast<token_expr *>(raw.front().at(1))->get_tree();
		if (t.root().data() == nullptr)
			throw internal_error("Null pointer accessed.");
		if (t.root().data()->get_type() != token_types::id)
			throw compile_error("Wrong grammar in foreach statement, expect <id>");
		const std::string &it = static_cast<token_id *>(t.root().data())->get_id();
		std::deque<statement_base *> body;
		context->compiler->translate({raw.begin() + 1, raw.end()}, body);
		return new statement_foreach(it, static_cast<token_expr *>(raw.front().at(3))->get_tree(), {
			new statement_expression(static_cast<token_expr *>(raw.front().at(5))->get_tree(),
			                         context, raw.front().back())
		}, context,
		raw.front().back());
	}